

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

char * google::protobuf::FileDescriptor::SyntaxName(Syntax syntax)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Syntax local_14;
  char *pcStack_10;
  Syntax syntax_local;
  
  if (syntax == SYNTAX_UNKNOWN) {
    pcStack_10 = "unknown";
  }
  else if (syntax == SYNTAX_PROTO2) {
    pcStack_10 = "proto2";
  }
  else if (syntax == SYNTAX_PROTO3) {
    pcStack_10 = "proto3";
  }
  else {
    local_14 = syntax;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x166);
    other = internal::LogMessage::operator<<(&local_50,"can\'t reach here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* FileDescriptor::SyntaxName(FileDescriptor::Syntax syntax) {
  switch (syntax) {
    case SYNTAX_PROTO2:
      return "proto2";
    case SYNTAX_PROTO3:
      return "proto3";
    case SYNTAX_UNKNOWN:
      return "unknown";
  }
  GOOGLE_LOG(FATAL) << "can't reach here.";
  return nullptr;
}